

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

string * __thiscall
spvtools::val::Instruction::GetOperandAs<std::__cxx11::string>
          (string *__return_storage_ptr__,Instruction *this,size_t index)

{
  const_reference pvVar1;
  uint *puVar2;
  undefined1 in_R8B;
  spv_parsed_operand_t *o;
  size_t index_local;
  Instruction *this_local;
  
  pvVar1 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::at
                     (&this->operands_,index);
  if ((uint)pvVar1->offset + (uint)pvVar1->num_words <= (uint)(this->inst_).num_words) {
    puVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data(&this->words_);
    utils::MakeString_abi_cxx11_
              (__return_storage_ptr__,(utils *)(puVar2 + (int)(uint)pvVar1->offset),
               (uint32_t *)(ulong)pvVar1->num_words,1,(bool)in_R8B);
    return __return_storage_ptr__;
  }
  __assert_fail("o.offset + o.num_words <= inst_.num_words",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/instruction.cpp"
                ,0x32,"std::string spvtools::val::Instruction::GetOperandAs(size_t) const");
}

Assistant:

std::string Instruction::GetOperandAs<std::string>(size_t index) const {
  const spv_parsed_operand_t& o = operands_.at(index);
  assert(o.offset + o.num_words <= inst_.num_words);
  return spvtools::utils::MakeString(words_.data() + o.offset, o.num_words);
}